

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::treeFind
          (overlap_iterator *this)

{
  size_type sVar1;
  pointer pEVar2;
  ulong uVar3;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar4;
  uint uVar5;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *pIVar6;
  int iVar7;
  ulong *puVar8;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this_00;
  uint32_t uVar9;
  long lVar10;
  ulong uVar11;
  BranchNode<unsigned_long,_8U,_false> *self;
  ulong uVar12;
  long lVar13;
  uint local_44;
  NodeRef local_40;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *local_38;
  
  sVar1 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if (sVar1 == 0) {
    return;
  }
  pEVar2 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  if (pEVar2->size <= pEVar2->offset) {
    return;
  }
  this_00 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
            &(this->super_iterator).super_const_iterator.path;
  iVar7 = (int)sVar1;
  uVar5 = iVar7 - 1;
  pIVar6 = (this->super_iterator).super_const_iterator.map;
  uVar9 = pIVar6->height;
  PVar4.value = *(ulong *)((long)pEVar2[uVar5].node + (ulong)pEVar2[uVar5].offset * 8);
  iVar7 = uVar9 - iVar7;
  if (iVar7 != 0) {
    do {
      uVar12 = PVar4.value & 0xffffffffffffffc0;
      lVar10 = 0x48;
      lVar13 = 0;
LAB_002d208b:
      if ((this->searchKey).right < *(ulong *)((uVar12 - 8) + lVar10)) goto LAB_002d2111;
      if (*(ulong *)(uVar12 + lVar10) < (this->searchKey).left) goto code_r0x002d2099;
      local_44 = (uint)lVar13;
      local_40.pip.value =
           (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
           (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
      local_38 = this_00;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>(this_00,&local_40,&local_44);
      PVar4.value = *(ulong *)(uVar12 + lVar13 * 8);
      iVar7 = iVar7 + -1;
      this_00 = local_38;
    } while (iVar7 != 0);
    pIVar6 = (this->super_iterator).super_const_iterator.map;
    uVar9 = pIVar6->height;
  }
  uVar5 = ((uint)PVar4.value & 0x3f) + 1;
  uVar12 = (this->searchKey).left;
  uVar3 = (this->searchKey).right;
  puVar8 = (ulong *)((PVar4.value & 0xffffffffffffffc0) + 8);
  if (uVar9 == 0) {
    uVar11 = 0;
    do {
      if (uVar3 < puVar8[-1]) break;
      if (uVar12 <= *puVar8) goto LAB_002d2135;
      uVar11 = uVar11 + 1;
      puVar8 = puVar8 + 2;
    } while (uVar5 != uVar11);
  }
  else {
    uVar11 = 0;
    do {
      if (uVar3 < puVar8[-1]) break;
      if (uVar12 <= *puVar8) goto LAB_002d2135;
      uVar11 = uVar11 + 1;
      puVar8 = puVar8 + 2;
    } while (uVar5 != uVar11);
  }
LAB_002d213a:
  uVar9 = pIVar6->rootSize;
LAB_002d213d:
  const_iterator::setRoot((const_iterator *)this,uVar9);
  return;
code_r0x002d2099:
  lVar13 = lVar13 + 1;
  lVar10 = lVar10 + 0x10;
  if ((ulong)((uint)PVar4.value & 0x3f) + 1 == lVar13) {
LAB_002d2111:
    uVar9 = ((this->super_iterator).super_const_iterator.map)->rootSize;
    goto LAB_002d213d;
  }
  goto LAB_002d208b;
LAB_002d2135:
  if (uVar5 != (uint)uVar11) {
    local_44 = (uint)uVar11;
    local_40.pip.value =
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>(this_00,&local_40,&local_44);
    return;
  }
  goto LAB_002d213a;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }